

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void * arena_bin_malloc_no_fresh_slab(tsdn_t *tsdn,arena_t *arena,bin_t *bin,szind_t binind)

{
  uint64_t uVar1;
  _Bool _Var2;
  void *pvVar3;
  
  uVar1 = (arena->stats).mutex_prof_data[0].tot_wait_time.ns;
  if ((uVar1 == 0) || ((*(ushort *)(uVar1 + 3) & 0x3ff0) == 0)) {
    _Var2 = arena_bin_refill_slabcur_no_fresh_slab(tsdn,arena,bin);
    if (_Var2) {
      return (void *)0x0;
    }
  }
  pvVar3 = arena_slab_reg_alloc
                     ((edata_t *)(arena->stats).mutex_prof_data[0].tot_wait_time.ns,
                      duckdb_je_bin_infos + ((ulong)bin & 0xffffffff));
  return pvVar3;
}

Assistant:

static void *
arena_bin_malloc_no_fresh_slab(tsdn_t *tsdn, arena_t *arena, bin_t *bin,
    szind_t binind) {
	malloc_mutex_assert_owner(tsdn, &bin->lock);
	if (bin->slabcur == NULL || edata_nfree_get(bin->slabcur) == 0) {
		if (arena_bin_refill_slabcur_no_fresh_slab(tsdn, arena, bin)) {
			return NULL;
		}
	}

	assert(bin->slabcur != NULL && edata_nfree_get(bin->slabcur) > 0);
	return arena_slab_reg_alloc(bin->slabcur, &bin_infos[binind]);
}